

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qevent.cpp
# Opt level: O0

void __thiscall
QSinglePointEvent::QSinglePointEvent
          (QSinglePointEvent *this,Type type,QPointingDevice *dev,QEventPoint *point,
          MouseButton button,MouseButtons buttons,KeyboardModifiers modifiers,
          MouseEventSource source)

{
  long lVar1;
  undefined8 in_RDX;
  undefined4 in_ESI;
  QPointerEvent *in_RDI;
  undefined4 in_R8D;
  undefined4 in_R9D;
  long in_FS_OFFSET;
  undefined4 in_stack_00000008;
  undefined4 in_stack_ffffffffffffffc0;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  QPointerEvent::QPointerEvent(in_RDI,in_ESI,in_RDX,in_stack_00000008);
  *(undefined ***)&in_RDI->super_QInputEvent = &PTR__QSinglePointEvent_00e15758;
  *(undefined4 *)&in_RDI[1].super_QInputEvent = in_R8D;
  *(undefined4 *)&in_RDI[1].super_QInputEvent.field_0x4 = in_R9D;
  *(undefined4 *)&in_RDI[1].super_QInputEvent.field_0x8 = point._0_4_;
  *(undefined2 *)&in_RDI[1].super_QInputEvent.field_0xc = 0;
  *(ushort *)&in_RDI[1].super_QInputEvent.field_0xe =
       *(ushort *)&in_RDI[1].super_QInputEvent.field_0xe & 0xf800;
  in_RDI[1].super_QInputEvent.field_0xf = in_RDI[1].super_QInputEvent.field_0xf & 0xf7;
  in_RDI[1].super_QInputEvent.field_0xf = in_RDI[1].super_QInputEvent.field_0xf & 0x8f;
  in_RDI[1].super_QInputEvent.field_0xf = in_RDI[1].super_QInputEvent.field_0xf & 0x7f;
  QList<QEventPoint>::operator<<
            ((QList<QEventPoint> *)CONCAT44(in_R8D,in_stack_ffffffffffffffc0),(parameter_type)in_RDI
            );
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

QSinglePointEvent::QSinglePointEvent(QEvent::Type type, const QPointingDevice *dev, const QEventPoint &point,
                                     Qt::MouseButton button, Qt::MouseButtons buttons,
                                     Qt::KeyboardModifiers modifiers, Qt::MouseEventSource source)
    : QPointerEvent(type, QEvent::SinglePointEventTag{}, dev, modifiers),
      m_button(button),
      m_mouseState(buttons),
      m_source(source),
      m_reserved(0), m_reserved2(0),
      m_doubleClick(false), m_phase(0), m_invertedScrolling(0)
{
    m_points << point;
}